

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O2

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,string *s)

{
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> MStack_68;
  string local_50 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0013f818;
  std::__cxx11::string::string(local_50,(string *)s);
  std::__cxx11::string::string((string *)&local_30,local_50);
  Matcher<std::basic_string_view<char,std::char_traits<char>>>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<std::basic_string_view<char,std::char_traits<char>>> *)&MStack_68,&local_30);
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             &MStack_68);
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::~MatcherBase
            (&MStack_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const std::string& s) { *this = Eq(s); }